

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectPoller.cpp
# Opt level: O1

void __thiscall sznet::net::SelectPoller::removeChannel(SelectPoller *this,Channel *channel)

{
  _Rb_tree_header *p_Var1;
  ChannelMap *this_00;
  pointer *ppEVar2;
  int iVar3;
  EventLoop *this_01;
  pointer pEVar4;
  size_t sVar5;
  pointer pEVar6;
  Event_t EVar7;
  bool bVar8;
  mapped_type *ppCVar9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  long lVar12;
  SourceFile file;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_sznet::net::Channel_*>_>,_std::_Rb_tree_iterator<std::pair<const_int,_sznet::net::Channel_*>_>_>
  pVar13;
  undefined1 local_ff8 [8];
  sz_fd channelAtEndFd;
  char *local_48;
  
  this_01 = (this->super_Poller).m_ownerLoop;
  bVar8 = EventLoop::isInLoopThread(this_01);
  if (!bVar8) {
    EventLoop::abortNotInLoopThread(this_01);
  }
  if (g_logLevel < 1) {
    file._8_8_ = 0x10;
    file.m_data = "SelectPoller.cpp";
    Logger::Logger((Logger *)local_ff8,file,0x8e,TRACE,"removeChannel");
    if (5 < (uint)((int)&stack0xffffffffffffffb8 - (int)local_48)) {
      builtin_strncpy(local_48,"fd = ",5);
      local_48 = local_48 + 5;
    }
    LogStream::operator<<((LogStream *)&channelAtEndFd,channel->m_fd);
    Logger::~Logger((Logger *)local_ff8);
  }
  local_ff8._0_4_ = channel->m_fd;
  p_Var1 = &(this->super_Poller).m_channels._M_t._M_impl.super__Rb_tree_header;
  p_Var11 = (this->super_Poller).m_channels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var10 = &p_Var1->_M_header;
  for (; p_Var11 != (_Base_ptr)0x0;
      p_Var11 = (&p_Var11->_M_left)[(int)p_Var11[1]._M_color < (int)local_ff8._0_4_]) {
    if ((int)local_ff8._0_4_ <= (int)p_Var11[1]._M_color) {
      p_Var10 = p_Var11;
    }
  }
  p_Var11 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var10 != p_Var1) &&
     (p_Var11 = p_Var10, (int)local_ff8._0_4_ < (int)p_Var10[1]._M_color)) {
    p_Var11 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var11 == p_Var1) {
    __assert_fail("m_channels.find(channel->fd()) != m_channels.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                  ,0x8f,"virtual void sznet::net::SelectPoller::removeChannel(Channel *)");
  }
  this_00 = &(this->super_Poller).m_channels;
  ppCVar9 = std::
            map<int,_sznet::net::Channel_*,_std::less<int>,_std::allocator<std::pair<const_int,_sznet::net::Channel_*>_>_>
            ::operator[](this_00,(key_type *)local_ff8);
  if (*ppCVar9 != channel) {
    __assert_fail("m_channels[channel->fd()] == channel",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                  ,0x90,"virtual void sznet::net::SelectPoller::removeChannel(Channel *)");
  }
  if (channel->m_events == 0) {
    iVar3 = channel->m_index;
    lVar12 = (long)iVar3;
    if ((lVar12 < 0) ||
       (pEVar4 = (this->m_pollfds).
                 super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       (int)((ulong)((long)(this->m_pollfds).
                           super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar4) >> 3) <= iVar3
       )) {
      __assert_fail("0 <= idx && idx < static_cast<int>(m_pollfds.size())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                    ,0x93,"virtual void sznet::net::SelectPoller::removeChannel(Channel *)");
    }
    if (pEVar4[lVar12].ev != 0) {
      __assert_fail("event.ev == channel->events()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                    ,0x95,"virtual void sznet::net::SelectPoller::removeChannel(Channel *)");
    }
    local_ff8._0_4_ = channel->m_fd;
    pVar13 = std::
             _Rb_tree<int,_std::pair<const_int,_sznet::net::Channel_*>,_std::_Select1st<std::pair<const_int,_sznet::net::Channel_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_sznet::net::Channel_*>_>_>
             ::equal_range(&this_00->_M_t,(key_type *)local_ff8);
    sVar5 = (this->super_Poller).m_channels._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::
    _Rb_tree<int,_std::pair<const_int,_sznet::net::Channel_*>,_std::_Select1st<std::pair<const_int,_sznet::net::Channel_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_sznet::net::Channel_*>_>_>
    ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar13.first._M_node,(_Base_ptr)pVar13.second._M_node);
    if (sVar5 - (this->super_Poller).m_channels._M_t._M_impl.super__Rb_tree_header._M_node_count ==
        1) {
      pEVar4 = (this->m_pollfds).
               super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pEVar6 = (this->m_pollfds).
               super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (((long)pEVar6 - (long)pEVar4 >> 3) + -1 == lVar12) {
        (this->m_pollfds).
        super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
        ._M_impl.super__Vector_impl_data._M_finish = pEVar6 + -1;
      }
      else {
        local_ff8._0_4_ = pEVar6[-1].fd;
        EVar7 = pEVar4[lVar12];
        pEVar4[lVar12] = pEVar6[-1];
        pEVar6[-1] = EVar7;
        ppCVar9 = std::
                  map<int,_sznet::net::Channel_*,_std::less<int>,_std::allocator<std::pair<const_int,_sznet::net::Channel_*>_>_>
                  ::operator[](this_00,(key_type *)local_ff8);
        (*ppCVar9)->m_index = iVar3;
        ppEVar2 = &(this->m_pollfds).
                   super__Vector_base<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppEVar2 = *ppEVar2 + -1;
      }
      return;
    }
    __assert_fail("n == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                  ,0x99,"virtual void sznet::net::SelectPoller::removeChannel(Channel *)");
  }
  __assert_fail("channel->isNoneEvent()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                ,0x91,"virtual void sznet::net::SelectPoller::removeChannel(Channel *)");
}

Assistant:

void SelectPoller::removeChannel(Channel* channel)
{
	Poller::assertInLoopThread();
	LOG_TRACE << "fd = " << channel->fd();
	assert(m_channels.find(channel->fd()) != m_channels.end());
	assert(m_channels[channel->fd()] == channel);
	assert(channel->isNoneEvent());
	int idx = channel->index();
	assert(0 <= idx && idx < static_cast<int>(m_pollfds.size()));
	const Channel::Event_t& event = m_pollfds[idx];
	assert(event.ev == channel->events());
	(void)event;
	// 移除
	size_t n = m_channels.erase(channel->fd());
	assert(n == 1); 
	(void)n;
	if (implicit_cast<size_t>(idx) == m_pollfds.size() - 1)
	{
		m_pollfds.pop_back();
	}
	else
	{
		auto channelAtEndFd = m_pollfds.back().fd;
		// 不要影响其他channel的下标
		std::iter_swap(m_pollfds.begin() + idx, m_pollfds.end() - 1);
		// 因为交换了位置，所以index发生了变化
		m_channels[channelAtEndFd]->set_index(idx);
		m_pollfds.pop_back();
	}
}